

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

ESlotDef __thiscall FWeaponSlots::AddDefaultWeapon(FWeaponSlots *this,int slot,PClassWeapon *type)

{
  bool bVar1;
  int local_30;
  bool added;
  int index;
  int currSlot;
  PClassWeapon *type_local;
  FWeaponSlots *pFStack_18;
  int slot_local;
  FWeaponSlots *this_local;
  
  _index = type;
  type_local._4_4_ = slot;
  pFStack_18 = this;
  bVar1 = LocateWeapon(this,type,(int *)&stack0xffffffffffffffd4,&local_30);
  if (bVar1) {
    this_local._4_4_ = SLOTDEF_Exists;
  }
  else if ((type_local._4_4_ < 0) || (9 < type_local._4_4_)) {
    this_local._4_4_ = SLOTDEF_Full;
  }
  else {
    bVar1 = FWeaponSlot::AddWeapon(this->Slots + type_local._4_4_,_index);
    this_local._4_4_ = SLOTDEF_Full;
    if (bVar1) {
      this_local._4_4_ = SLOTDEF_Added;
    }
  }
  return this_local._4_4_;
}

Assistant:

ESlotDef FWeaponSlots::AddDefaultWeapon (int slot, PClassWeapon *type)
{
	int currSlot, index;

	if (!LocateWeapon (type, &currSlot, &index))
	{
		if (slot >= 0 && slot < NUM_WEAPON_SLOTS)
		{
			bool added = Slots[slot].AddWeapon (type);
			return added ? SLOTDEF_Added : SLOTDEF_Full;
		}
		return SLOTDEF_Full;
	}
	return SLOTDEF_Exists;
}